

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

bool __thiscall
Js::InterpreterStackFrame::
TrySetPropertyLocalFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,PropertyId pid,
          RecyclableObject *instance,InlineCache **inlineCache,PropertyOperationFlags flags)

{
  byte bVar1;
  InlineCache *inlineCache_00;
  Var value;
  ScriptContext *requestContext;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined1 local_80 [8];
  PropertyValueInfo info;
  
  bVar1 = playout->inlineCacheIndex;
  info._56_8_ = instance;
  if (*(long *)(this + 0x90) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x378,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar3) goto LAB_00a7ad92;
    *puVar4 = 0;
  }
  if (*(uint *)(this + 200) <= (uint)bVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                "cacheIndex < this->inlineCacheCount");
    if (!bVar3) goto LAB_00a7ad92;
    *puVar4 = 0;
  }
  inlineCache_00 = *(InlineCache **)(*(long *)(this + 0x90) + (ulong)bVar1 * 8);
  *inlineCache = inlineCache_00;
  local_80 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_80,*(FunctionBody **)(this + 0x88),inlineCache_00,
             (uint)playout->inlineCacheIndex,true);
  value = *(Var *)(this + (ulong)playout->Value * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  requestContext = *(ScriptContext **)(this + 0x78);
  if (info._8_8_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                ,0x94,
                                "(IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache())",
                                "IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache()");
    if (!bVar3) goto LAB_00a7ad92;
    *puVar4 = 0;
  }
  if (info.inlineCache != (InlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                ,0x95,
                                "(IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache())"
                                ,
                                "IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache()"
                               );
    if (!bVar3) {
LAB_00a7ad92:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  bVar3 = InlineCache::TrySetProperty<true,false,false,false>
                    ((InlineCache *)info._8_8_,(RecyclableObject *)info._56_8_,pid,value,
                     requestContext,(PropertyCacheOperationInfo *)0x0,flags);
  return bVar3;
}

Assistant:

inline bool InterpreterStackFrame::TrySetPropertyLocalFastPath(unaligned T* playout, PropertyId pid, RecyclableObject* instance, InlineCache*& inlineCache, PropertyOperationFlags flags)
    {
        inlineCache = this->GetInlineCache(playout->inlineCacheIndex);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
        return
            CacheOperators::TrySetProperty<true, false, false, false, false, true, false, false>(
                instance,
                !!(flags & PropertyOperation_Root),
                pid,
                GetReg(playout->Value),
                GetScriptContext(),
                flags,
                nullptr,
                &info);
    }